

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O1

int nni_thr_init(nni_thr *thr,nni_thr_func fn,void *arg)

{
  nni_plat_mtx *mtx;
  int iVar1;
  
  thr->done = 0;
  thr->start = 0;
  thr->stop = 0;
  thr->fn = fn;
  thr->arg = arg;
  mtx = &thr->mtx;
  nni_plat_mtx_init(mtx);
  nni_plat_cv_init(&thr->cv,mtx);
  if (fn == (nni_thr_func)0x0) {
    thr->done = 1;
    thr->init = 1;
  }
  else {
    iVar1 = nni_plat_thr_init(&thr->thr,nni_thr_wrap,thr);
    if (iVar1 != 0) {
      thr->done = 1;
      nni_plat_cv_fini(&thr->cv);
      nni_plat_mtx_fini(mtx);
      return iVar1;
    }
    thr->init = 1;
  }
  return 0;
}

Assistant:

int
nni_thr_init(nni_thr *thr, nni_thr_func fn, void *arg)
{
	int rv;

	thr->done  = 0;
	thr->start = 0;
	thr->stop  = 0;
	thr->fn    = fn;
	thr->arg   = arg;

	nni_plat_mtx_init(&thr->mtx);
	nni_plat_cv_init(&thr->cv, &thr->mtx);

	if (fn == NULL) {
		thr->init = 1;
		thr->done = 1;
		return (0);
	}
	if ((rv = nni_plat_thr_init(&thr->thr, nni_thr_wrap, thr)) != 0) {
		thr->done = 1;
		nni_plat_cv_fini(&thr->cv);
		nni_plat_mtx_fini(&thr->mtx);
		return (rv);
	}
	thr->init = 1;
	return (0);
}